

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_mock_inlets.h
# Opt level: O2

void __thiscall c74::max::object_inlets::object_inlets(object_inlets *this,void *x)

{
  value_type local_48;
  
  (this->mock_inlets).
  super__Vector_base<c74::max::t_mock_inlet,_std::allocator<c74::max::t_mock_inlet>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->current_inlet = 0;
  (this->mock_inlets).
  super__Vector_base<c74::max::t_mock_inlet,_std::allocator<c74::max::t_mock_inlet>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mock_inlets).
  super__Vector_base<c74::max::t_mock_inlet,_std::allocator<c74::max::t_mock_inlet>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.m_messages.
  super__Vector_base<std::vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>,_std::allocator<std::vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.m_messages.
  super__Vector_base<std::vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>,_std::allocator<std::vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.m_messages.
  super__Vector_base<std::vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>,_std::allocator<std::vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.m_id = 0;
  local_48.m_stuffloc = (long *)0x0;
  local_48.m_owner = x;
  std::vector<c74::max::t_mock_inlet,_std::allocator<c74::max::t_mock_inlet>_>::push_back
            (&this->mock_inlets,&local_48);
  std::
  vector<std::vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>,_std::allocator<std::vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>_>_>
  ::~vector(&local_48.m_messages);
  return;
}

Assistant:

explicit object_inlets(void* x)
    : current_inlet(0)
    {
        t_mock_inlet inlet(x, 0, NULL);

        mock_inlets.push_back(inlet);
    }